

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O0

void __thiscall
Time::LocalTime::LocalTime
          (LocalTime *this,int year,int month,int dayOfMonth,int hour,int min,int sec)

{
  time_t second;
  time_t tVar1;
  undefined1 local_60 [8];
  tm tmt;
  int min_local;
  int hour_local;
  int dayOfMonth_local;
  int month_local;
  int year_local;
  LocalTime *this_local;
  
  tmt.tm_zone._4_4_ = min;
  second = time((time_t *)0x0);
  Time::Time(&this->super_Time,second,0);
  (this->super_Time)._vptr_Time = (_func_int **)&PTR_getAsDate_0013cc40;
  local_60._4_4_ = tmt.tm_zone._4_4_;
  local_60._0_4_ = sec;
  tmt.tm_wday = -1;
  tmt.tm_sec = hour;
  tmt.tm_min = dayOfMonth;
  tmt.tm_hour = month;
  tmt.tm_mday = year;
  tVar1 = makeTime((tm *)local_60);
  (this->super_Time).timeSinceEpoch.tv_sec = tVar1;
  return;
}

Assistant:

LocalTime::LocalTime(const int year, const int month, const int dayOfMonth, const int hour, const int min, const int sec)
        : Time(time(NULL), 0)
    {
        struct tm tmt;
        tmt.tm_year = year;
        tmt.tm_mon = month;
        tmt.tm_mday = dayOfMonth;
        tmt.tm_hour = hour;
        tmt.tm_min = min;
        tmt.tm_sec = sec;
        tmt.tm_isdst = -1;
        timeSinceEpoch.tv_sec = makeTime(&tmt);
    }